

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void substrFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  sqlite3 *psVar4;
  uchar *puVar5;
  byte *pbVar6;
  bool bVar7;
  sqlite3_uint64 sStack_48;
  int negP2;
  i64 p2;
  i64 p1;
  int p0type;
  int len;
  uchar *z2;
  uchar *z;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  bVar7 = false;
  iVar2 = sqlite3_value_type(argv[1]);
  if ((iVar2 != 5) && ((argc != 3 || (iVar2 = sqlite3_value_type(argv[2]), iVar2 != 5)))) {
    iVar2 = sqlite3_value_type(*argv);
    iVar3 = sqlite3_value_int(argv[1]);
    p2 = (i64)iVar3;
    if (iVar2 == 4) {
      p1._4_4_ = sqlite3_value_bytes(*argv);
      z2 = (uchar *)sqlite3_value_blob(*argv);
      if (z2 == (uchar *)0x0) {
        return;
      }
    }
    else {
      z2 = sqlite3_value_text(*argv);
      if (z2 == (byte *)0x0) {
        return;
      }
      p1._4_4_ = 0;
      _p0type = z2;
      if (p2 < 0) {
        while (*_p0type != 0) {
          pbVar6 = _p0type + 1;
          bVar1 = *_p0type;
          _p0type = pbVar6;
          if (0xbf < bVar1) {
            for (; (*_p0type & 0xc0) == 0x80; _p0type = _p0type + 1) {
            }
          }
          p1._4_4_ = p1._4_4_ + 1;
        }
      }
    }
    if (argc == 3) {
      iVar3 = sqlite3_value_int(argv[2]);
      sStack_48 = (sqlite3_uint64)iVar3;
      bVar7 = (long)sStack_48 < 0;
      if (bVar7) {
        sStack_48 = -sStack_48;
      }
    }
    else {
      psVar4 = sqlite3_context_db_handle(context);
      sStack_48 = (sqlite3_uint64)psVar4->aLimit[0];
    }
    if (p2 < 0) {
      p2 = p1._4_4_ + p2;
      if (p2 < 0) {
        sStack_48 = p2 + sStack_48;
        if ((long)sStack_48 < 0) {
          sStack_48 = 0;
        }
        p2 = 0;
      }
    }
    else if (p2 < 1) {
      if (0 < (long)sStack_48) {
        sStack_48 = sStack_48 - 1;
      }
    }
    else {
      p2 = p2 + -1;
    }
    if ((bVar7) && (p2 = p2 - sStack_48, p2 < 0)) {
      sStack_48 = p2 + sStack_48;
      p2 = 0;
    }
    if (iVar2 == 4) {
      if (((long)p1._4_4_ < (long)(p2 + sStack_48)) &&
         (sStack_48 = p1._4_4_ - p2, (long)sStack_48 < 0)) {
        sStack_48 = 0;
      }
      sqlite3_result_blob64(context,z2 + p2,sStack_48,(_func_void_void_ptr *)0xffffffffffffffff);
    }
    else {
      for (; *z2 != '\0' && p2 != 0; p2 = p2 + -1) {
        puVar5 = z2 + 1;
        bVar1 = *z2;
        z2 = puVar5;
        if (0xbf < bVar1) {
          for (; (*z2 & 0xc0) == 0x80; z2 = z2 + 1) {
          }
        }
      }
      _p0type = z2;
      for (; *_p0type != 0 && sStack_48 != 0; sStack_48 = sStack_48 - 1) {
        pbVar6 = _p0type + 1;
        bVar1 = *_p0type;
        _p0type = pbVar6;
        if (0xbf < bVar1) {
          for (; (*_p0type & 0xc0) == 0x80; _p0type = _p0type + 1) {
          }
        }
      }
      sqlite3_result_text64
                (context,(char *)z2,(long)_p0type - (long)z2,
                 (_func_void_void_ptr *)0xffffffffffffffff,'\x01');
    }
  }
  return;
}

Assistant:

static void substrFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *z;
  const unsigned char *z2;
  int len;
  int p0type;
  i64 p1, p2;
  int negP2 = 0;

  assert( argc==3 || argc==2 );
  if( sqlite3_value_type(argv[1])==SQLITE_NULL
   || (argc==3 && sqlite3_value_type(argv[2])==SQLITE_NULL)
  ){
    return;
  }
  p0type = sqlite3_value_type(argv[0]);
  p1 = sqlite3_value_int(argv[1]);
  if( p0type==SQLITE_BLOB ){
    len = sqlite3_value_bytes(argv[0]);
    z = sqlite3_value_blob(argv[0]);
    if( z==0 ) return;
    assert( len==sqlite3_value_bytes(argv[0]) );
  }else{
    z = sqlite3_value_text(argv[0]);
    if( z==0 ) return;
    len = 0;
    if( p1<0 ){
      for(z2=z; *z2; len++){
        SQLITE_SKIP_UTF8(z2);
      }
    }
  }
#ifdef SQLITE_SUBSTR_COMPATIBILITY
  /* If SUBSTR_COMPATIBILITY is defined then substr(X,0,N) work the same as
  ** as substr(X,1,N) - it returns the first N characters of X.  This
  ** is essentially a back-out of the bug-fix in check-in [5fc125d362df4b8]
  ** from 2009-02-02 for compatibility of applications that exploited the
  ** old buggy behavior. */
  if( p1==0 ) p1 = 1; /* <rdar://problem/6778339> */
#endif
  if( argc==3 ){
    p2 = sqlite3_value_int(argv[2]);
    if( p2<0 ){
      p2 = -p2;
      negP2 = 1;
    }
  }else{
    p2 = sqlite3_context_db_handle(context)->aLimit[SQLITE_LIMIT_LENGTH];
  }
  if( p1<0 ){
    p1 += len;
    if( p1<0 ){
      p2 += p1;
      if( p2<0 ) p2 = 0;
      p1 = 0;
    }
  }else if( p1>0 ){
    p1--;
  }else if( p2>0 ){
    p2--;
  }
  if( negP2 ){
    p1 -= p2;
    if( p1<0 ){
      p2 += p1;
      p1 = 0;
    }
  }
  assert( p1>=0 && p2>=0 );
  if( p0type!=SQLITE_BLOB ){
    while( *z && p1 ){
      SQLITE_SKIP_UTF8(z);
      p1--;
    }
    for(z2=z; *z2 && p2; p2--){
      SQLITE_SKIP_UTF8(z2);
    }
    sqlite3_result_text64(context, (char*)z, z2-z, SQLITE_TRANSIENT,
                          SQLITE_UTF8);
  }else{
    if( p1+p2>len ){
      p2 = len-p1;
      if( p2<0 ) p2 = 0;
    }
    sqlite3_result_blob64(context, (char*)&z[p1], (u64)p2, SQLITE_TRANSIENT);
  }
}